

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
          (Memory *this,u64 offset,u64 addend,uchar rhs,
          BinopFunc<unsigned_char,_unsigned_char> **func,uchar *out)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  uchar uVar4;
  Enum EVar5;
  ulong uVar6;
  uchar unaff_R13B;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  uVar6 = (long)puVar2 - (long)puVar1;
  if ((((puVar2 != puVar1) && (offset <= uVar6)) && (addend <= uVar6)) &&
     (offset + addend + 1 <= uVar6)) {
    unaff_R13B = puVar1[addend + offset];
    bVar3 = false;
  }
  EVar5 = Error;
  if (!bVar3) {
    uVar4 = (**func)(unaff_R13B,rhs);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    uVar6 = (long)puVar2 - (long)puVar1;
    if (((puVar2 != puVar1) && (offset <= uVar6)) &&
       ((addend <= uVar6 && (offset + addend + 1 <= uVar6)))) {
      puVar1[addend + offset] = uVar4;
      *out = unaff_R13B;
      EVar5 = Ok;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}